

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls)

{
  U32 h_00;
  uint uVar1;
  U32 UVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  uint uVar6;
  BYTE *p;
  U32 *sortMarkPtr;
  U32 *nextCandidatePtr;
  U32 matchIndex;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  size_t local_10;
  
  pUVar3 = ms->hashTable;
  h_00 = (ms->cParams).hashLog;
  pUVar4 = ms->chainTable;
  uVar1 = (ms->cParams).chainLog;
  pBVar5 = (ms->window).base;
  uVar6 = (int)ip - (int)pBVar5;
  for (h._0_4_ = ms->nextToUpdate; (U32)h < uVar6; h._0_4_ = (U32)h + 1) {
    p = pBVar5 + (U32)h;
    switch(mls) {
    default:
      local_10 = ZSTD_hash4Ptr(p,h_00);
      break;
    case 5:
      local_10 = ZSTD_hash5Ptr(p,h_00);
      break;
    case 6:
      local_10 = ZSTD_hash6Ptr(p,h_00);
      break;
    case 7:
      local_10 = ZSTD_hash7Ptr(p,h_00);
      break;
    case 8:
      local_10 = ZSTD_hash8Ptr(p,h_00);
    }
    UVar2 = pUVar3[local_10];
    pUVar3[local_10] = (U32)h;
    pUVar4[((U32)h & (1 << ((char)uVar1 - 1U & 0x1f)) - 1U) << 1] = UVar2;
    (pUVar4 + (((U32)h & (1 << ((char)uVar1 - 1U & 0x1f)) - 1U) << 1))[1] = 1;
  }
  ms->nextToUpdate = uVar6;
  return;
}

Assistant:

static void
ZSTD_updateDUBT(ZSTD_matchState_t* ms,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}